

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void * google::protobuf::AllocIfDefault<void>(FieldDescriptor *field,void **ptr,Arena *arena)

{
  void *pvVar1;
  CppType CVar2;
  CppStringType CVar3;
  void *pvVar4;
  RepeatedField<int> *pRVar5;
  RepeatedPtrFieldBase *pRVar6;
  Arena *arena_local;
  void **ptr_local;
  FieldDescriptor *field_local;
  
  pvVar1 = *ptr;
  pvVar4 = internal::DefaultRawPtr();
  if (pvVar1 == pvVar4) {
    CVar2 = FieldDescriptor::cpp_type(field);
    if (((int)CVar2 < 9) ||
       ((CVar2 = FieldDescriptor::cpp_type(field), CVar2 == CPPTYPE_STRING &&
        (CVar3 = FieldDescriptor::cpp_string_type(field), CVar3 == kCord)))) {
      pRVar5 = Arena::Create<google::protobuf::RepeatedField<int>>(arena);
      *ptr = pRVar5;
    }
    else {
      pRVar6 = Arena::Create<google::protobuf::internal::RepeatedPtrFieldBase>(arena);
      *ptr = pRVar6;
    }
  }
  return *ptr;
}

Assistant:

static Type* AllocIfDefault(const FieldDescriptor* field, Type*& ptr,
                            Arena* arena) {
  if (ptr == internal::DefaultRawPtr()) {
    // Note: we can't rely on Type to distinguish between these cases (Type can
    // be e.g. char).
    if (field->cpp_type() < FieldDescriptor::CPPTYPE_STRING ||
        (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING &&
         field->cpp_string_type() == FieldDescriptor::CppStringType::kCord)) {
      ptr =
          reinterpret_cast<Type*>(Arena::Create<RepeatedField<int32_t>>(arena));
    } else {
      ptr = reinterpret_cast<Type*>(Arena::Create<RepeatedPtrFieldBase>(arena));
    }
  }
  return ptr;
}